

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_settings.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::proxy_settings::proxy_settings(proxy_settings *this,session_settings *sett)

{
  mutex *pmVar1;
  int iVar2;
  _WordT _Var3;
  unique_lock<std::mutex> local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  string *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->hostname).field_2;
  (this->hostname)._M_dataplus._M_p = (pointer)local_38;
  (this->hostname)._M_string_length = 0;
  (this->hostname).field_2._M_local_buf[0] = '\0';
  local_48 = (string *)&this->username;
  local_40 = &(this->username).field_2;
  (this->username)._M_dataplus._M_p = (pointer)local_40;
  (this->username)._M_string_length = 0;
  (this->username).field_2._M_local_buf[0] = '\0';
  local_50 = &(this->password).field_2;
  (this->password)._M_dataplus._M_p = (pointer)local_50;
  (this->password)._M_string_length = 0;
  (this->password).field_2._M_local_buf[0] = '\0';
  this->type = none;
  this->port = 0;
  this->proxy_hostnames = true;
  this->proxy_peer_connections = true;
  this->proxy_tracker_connections = true;
  session_settings::get_str_abi_cxx11_(sett,6);
  ::std::__cxx11::string::_M_assign((string *)this);
  session_settings::get_str_abi_cxx11_(sett,7);
  ::std::__cxx11::string::_M_assign(local_48);
  session_settings::get_str_abi_cxx11_(sett,8);
  ::std::__cxx11::string::_M_assign((string *)&this->password);
  pmVar1 = &sett->m_mutex;
  local_60._M_owns = false;
  local_60._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  iVar2 = (sett->m_store).m_ints._M_elems[0x7b];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_60);
  this->type = (proxy_type_t)iVar2;
  local_60._M_owns = false;
  local_60._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  iVar2 = (sett->m_store).m_ints._M_elems[0x7c];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_60);
  this->port = (uint16_t)iVar2;
  local_60._M_owns = false;
  local_60._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  _Var3 = (sett->m_store).m_bools.super__Base_bitset<2UL>._M_w[1];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_60);
  this->proxy_hostnames = (bool)((byte)_Var3 & 1);
  local_60._M_owns = false;
  local_60._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  _Var3 = (sett->m_store).m_bools.super__Base_bitset<2UL>._M_w[1];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_60);
  this->proxy_peer_connections = (bool)((byte)_Var3 >> 1 & 1);
  local_60._M_owns = false;
  local_60._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  _Var3 = (sett->m_store).m_bools.super__Base_bitset<2UL>._M_w[1];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_60);
  this->proxy_tracker_connections = (bool)((byte)_Var3 >> 3 & 1);
  return;
}

Assistant:

proxy_settings::proxy_settings(aux::session_settings const& sett)
{ init(*this, sett); }